

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
fetch(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
     node_t *parent,
     vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
     *siblings)

{
  pointer *ppnVar1;
  size_t *psVar2;
  ulong uVar3;
  char *__s;
  iterator __position;
  pointer pnVar4;
  pointer pnVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  node_t tmp_node;
  node_t local_50;
  
  if (this->error_ < 0) {
    return 0;
  }
  uVar10 = parent->left;
  if (uVar10 < parent->right) {
    uVar9 = 0;
    do {
      psVar2 = this->length_;
      if (psVar2 == (size_t *)0x0) {
        uVar8 = strlen(this->key_[uVar10]);
      }
      else {
        uVar8 = psVar2[uVar10];
      }
      uVar3 = parent->depth;
      if (uVar3 <= uVar8) {
        __s = this->key_[uVar10];
        if (psVar2 == (size_t *)0x0) {
          uVar8 = strlen(__s);
        }
        else {
          uVar8 = psVar2[uVar10];
        }
        uVar11 = 0;
        if (uVar8 != uVar3) {
          uVar11 = (byte)__s[uVar3] + 1;
        }
        if (uVar11 < uVar9) {
          this->error_ = -3;
          uVar7 = uVar9;
        }
        else {
          uVar7 = uVar11;
          if ((uVar9 != uVar11) ||
             ((siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_start ==
              (siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_finish)) {
            local_50.depth = uVar3 + 1;
            __position._M_current =
                 (siblings->
                 super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if ((siblings->
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                )._M_impl.super__Vector_impl_data._M_start != __position._M_current) {
              __position._M_current[-1].right = uVar10;
            }
            local_50.code = uVar11;
            local_50.left = uVar10;
            if (__position._M_current ==
                (siblings->
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t,std::allocator<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t>>
              ::
              _M_realloc_insert<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t_const&>
                        ((vector<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t,std::allocator<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::node_t>>
                          *)siblings,__position,&local_50);
            }
            else {
              (__position._M_current)->left = uVar10;
              (__position._M_current)->right = local_50.right;
              *(ulong *)__position._M_current = CONCAT44(local_50._4_4_,uVar11);
              (__position._M_current)->depth = local_50.depth;
              ppnVar1 = &(siblings->
                         super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppnVar1 = *ppnVar1 + 1;
            }
          }
        }
        bVar6 = uVar11 < uVar9;
        uVar9 = uVar7;
        if (bVar6) {
          return 0;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < parent->right);
  }
  pnVar4 = (siblings->
           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (siblings->
           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pnVar4 != pnVar5) {
    pnVar5[-1].right = parent->right;
  }
  return (long)pnVar5 - (long)pnVar4 >> 5;
}

Assistant:

size_t fetch(const node_t &parent, std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    array_u_type_ prev = 0;

    for (size_t i = parent.left; i < parent.right; ++i) {
      if ((length_ ? length_[i] : length_func_()(key_[i])) < parent.depth)
        continue;

      const node_u_type_ *tmp = reinterpret_cast<node_u_type_ *>(key_[i]);

      array_u_type_ cur = 0;
      if ((length_ ? length_[i] : length_func_()(key_[i])) != parent.depth)
        cur = (array_u_type_)tmp[parent.depth] + 1;

      if (prev > cur) {
        error_ = -3;
        return 0;
      }

      if (cur != prev || siblings.empty()) {
        node_t tmp_node;
        tmp_node.depth = parent.depth + 1;
        tmp_node.code  = cur;
        tmp_node.left  = i;
        if (!siblings.empty()) siblings[siblings.size()-1].right = i;

        siblings.push_back(tmp_node);
      }

      prev = cur;
    }

    if (!siblings.empty())
      siblings[siblings.size()-1].right = parent.right;

    return siblings.size();
  }